

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O0

void osThread::dump_info(ostream *out)

{
  osThread *poVar1;
  osMutex *this;
  osEvent *this_00;
  _Setw _Var2;
  ostream *poVar3;
  char *pcVar4;
  osEvent *obj_1;
  osMutex *obj;
  osThread *thread;
  int i;
  ostream *out_local;
  
  std::operator<<(out,
                  "\n\n\"Reading\" means that the thread is reading a device or network socket\n\n")
  ;
  std::operator<<(out,"--------------------+------------------------------------\n");
  std::operator<<(out,"Thread Name         | State\n");
  std::operator<<(out,"--------------------+------------------------------------\n");
  osMutex::Take(&Mutex,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osThread.cpp"
                ,0x167);
  for (thread._4_4_ = 0; thread._4_4_ < 0x30; thread._4_4_ = thread._4_4_ + 1) {
    poVar1 = Threads[thread._4_4_];
    if (poVar1 != (osThread *)0x0) {
      _Var2 = std::setw(0x14);
      poVar3 = std::operator<<(out,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::left);
      poVar3 = std::operator<<(poVar3,poVar1->Name);
      std::operator<<(poVar3,"|");
      switch(poVar1->State) {
      case INIT:
        std::operator<<(out,"init\n");
        break;
      case RUNNING:
        std::operator<<(out,"running\n");
        break;
      case PENDING_MUTEX:
        this = (osMutex *)poVar1->StateObject;
        if (this == (osMutex *)0x0) {
          std::operator<<(out,"pending on mutex \"UNKNOWN\"\n");
        }
        else {
          poVar3 = std::operator<<(out,"pending on mutex \"");
          pcVar4 = osMutex::GetName(this);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::operator<<(poVar3,"\"\n");
        }
        break;
      case PENDING_EVENT:
        this_00 = (osEvent *)poVar1->StateObject;
        if (this_00 == (osEvent *)0x0) {
          std::operator<<(out,"pending event \"UNKNOWN\"\n");
        }
        else {
          poVar3 = std::operator<<(out,"pending event \"");
          pcVar4 = osEvent::GetName(this_00);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::operator<<(poVar3,"\"\n");
        }
        break;
      case SLEEPING:
        poVar3 = std::operator<<(out,"sleeping ");
        std::ostream::operator<<(poVar3,poVar1->USleepTime);
        poVar3 = std::operator<<(out," at ");
        poVar3 = std::operator<<(poVar3,poVar1->Filename);
        poVar3 = std::operator<<(poVar3," ");
        std::ostream::operator<<(poVar3,poVar1->Linenumber);
      }
    }
  }
  osMutex::Give(&Mutex);
  return;
}

Assistant:

void osThread::dump_info(std::ostream& out)
{
#ifdef WIN32
    FILETIME creationTime;
    FILETIME exitTime;
    FILETIME kernelTime;
    FILETIME userTime;
    SYSTEMTIME sysTime;
    HANDLE handle;

    handle = GetCurrentProcess();
    out << "Process Priority   = 0x" << to_hex(GetPriorityClass(handle)) << "\n";
    if (GetProcessTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime))
    {
        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << "  Kernel Time      = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << "  User Time        = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";
    }
#endif

    out << "\n\n\"Reading\" means that the thread is reading a device or network socket\n\n";

#ifdef WIN32
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
    out << "Pri |Thread Name         | ID    | Kernel Time  |  User Time   | State\n";
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
#elif __linux__
    out << "--------------------+------------------------------------\n";
    out << "Thread Name         | State\n";
    out << "--------------------+------------------------------------\n";
#endif

    Mutex.Take(__FILE__, __LINE__);

    for (int i = 0; i < MAX_THREADS; i++)
    {
        osThread* thread = Threads[i];
        if (!thread)
        {
            continue;
        }
#ifdef WIN32
        handle = thread->GetHandle();

        int priority;
        if (handle)
        {
            priority = GetThreadPriority(handle);
        }
        else
        {
            priority = -1;
        }
        GetThreadTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime);

        out << std::setw(3) << priority << " |";
        out << std::setw(20) << std::left << thread->Name << "|";
        out << std::setw(6) << handle << " | ";

        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

#elif __linux__
        out << std::setw(20) << std::left << thread->Name << "|";
#endif

        // Find out what this thread is doing
        switch (thread->State)
        {
        case INIT: out << "init\n"; break;
        case RUNNING: out << "running\n"; break;
        case PENDING_MUTEX:
        {
            osMutex* obj = (osMutex*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending on mutex \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending on mutex \"UNKNOWN\"\n";
            }
            break;
        }
        case PENDING_EVENT:
        {
            osEvent* obj = (osEvent*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending event \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending event \"UNKNOWN\"\n";
            }
            break;
        }
        case SLEEPING:
            out << "sleeping " << thread->USleepTime;
            out << " at " << thread->Filename << " " << thread->Linenumber;
            break;
        }
    }

    Mutex.Give();
}